

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

uchar * header_bytes(archive_read *a,size_t rbytes)

{
  ssize_t sVar1;
  undefined8 uVar2;
  ulong in_RSI;
  void **in_RDI;
  ssize_t bytes;
  void *buff;
  uchar *p;
  _7zip *zip;
  size_t in_stack_ffffffffffffffc8;
  archive_read *in_stack_ffffffffffffffd0;
  archive_read *local_28;
  size_t minimum;
  archive_read *in_stack_fffffffffffffff8;
  
  minimum = *in_RDI[0x129];
  if (*(ulong *)(minimum + 0x70) < in_RSI) {
    local_28 = (archive_read *)0x0;
  }
  else {
    if (*(long *)(minimum + 0x120) != 0) {
      read_consume(in_stack_ffffffffffffffd0);
    }
    if (*(int *)(minimum + 0x6c) == 0) {
      local_28 = (archive_read *)
                 __archive_read_ahead
                           (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(ssize_t *)0x19e1c7)
      ;
      if (local_28 == (archive_read *)0x0) {
        return (uchar *)0x0;
      }
      *(ulong *)(minimum + 0x70) = *(long *)(minimum + 0x70) - in_RSI;
      *(ulong *)(minimum + 0x120) = in_RSI;
    }
    else {
      sVar1 = read_stream(in_stack_fffffffffffffff8,in_RDI,in_RSI,minimum);
      if (sVar1 < 1) {
        return (uchar *)0x0;
      }
      *(long *)(minimum + 0x70) = *(long *)(minimum + 0x70) - sVar1;
      local_28 = in_stack_ffffffffffffffd0;
    }
    uVar2 = crc32(*(undefined8 *)(minimum + 0x78),local_28,in_RSI & 0xffffffff);
    *(undefined8 *)(minimum + 0x78) = uVar2;
  }
  return (uchar *)local_28;
}

Assistant:

static const unsigned char *
header_bytes(struct archive_read *a, size_t rbytes)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;

	if (zip->header_bytes_remaining < rbytes)
		return (NULL);
	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	if (zip->header_is_encoded == 0) {
		p = __archive_read_ahead(a, rbytes, NULL);
		if (p == NULL)
			return (NULL);
		zip->header_bytes_remaining -= rbytes;
		zip->pack_stream_bytes_unconsumed = rbytes;
	} else {
		const void *buff;
		ssize_t bytes;

		bytes = read_stream(a, &buff, rbytes, rbytes);
		if (bytes <= 0)
			return (NULL);
		zip->header_bytes_remaining -= bytes;
		p = buff;
	}

	/* Update checksum */
	zip->header_crc32 = crc32(zip->header_crc32, p, (unsigned)rbytes);
	return (p);
}